

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Function>::copyAppend
          (QGenericArrayOps<Function> *this,Function *b,Function *e)

{
  Function *pFVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pFVar1 = (this->super_QArrayDataPointer<Function>).ptr;
    lVar3 = (this->super_QArrayDataPointer<Function>).size;
    do {
      pDVar2 = (b->className).d.d;
      pFVar1[lVar3].className.d.d = pDVar2;
      pFVar1[lVar3].className.d.ptr = (b->className).d.ptr;
      pFVar1[lVar3].className.d.size = (b->className).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->functionName).d.d;
      pFVar1[lVar3].functionName.d.d = pDVar2;
      pFVar1[lVar3].functionName.d.ptr = (b->functionName).d.ptr;
      pFVar1[lVar3].functionName.d.size = (b->functionName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->functionParameters).d.d;
      pFVar1[lVar3].functionParameters.d.d = pDVar2;
      pFVar1[lVar3].functionParameters.d.ptr = (b->functionParameters).d.ptr;
      pFVar1[lVar3].functionParameters.d.size = (b->functionParameters).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<Function>).size + 1;
      (this->super_QArrayDataPointer<Function>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }